

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_257,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  BVH *bvh;
  NodeRef root;
  ulong uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  char cVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  ulong *puVar27;
  undefined4 uVar28;
  ulong unaff_R12;
  ulong uVar29;
  undefined1 (*pauVar30) [32];
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar45;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 in_ZMM0 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar56;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar66;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar62 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [16];
  float in_register_0000131c;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  float fVar82;
  float in_register_0000135c;
  undefined1 auVar81 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  vfloat4 a0;
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar95;
  float fVar100;
  float fVar101;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [64];
  float fVar106;
  float fVar112;
  float fVar113;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar111 [64];
  undefined1 auVar118 [16];
  float fVar120;
  undefined1 auVar119 [64];
  float fVar121;
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [32];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined1 local_5c60 [20];
  uint uStack_5c4c;
  undefined8 uStack_5c48;
  ulong local_5c40;
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  undefined1 local_5c20 [32];
  size_t local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined1 local_5be0 [32];
  undefined4 local_5bc0 [8];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ba0;
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  float fStack_5b24;
  undefined1 local_5b20 [8];
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  undefined1 local_5b00 [8];
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  float fStack_5ae4;
  undefined1 local_5ae0 [8];
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [64];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar33 [16];
  undefined1 auVar34 [28];
  undefined1 auVar74 [32];
  undefined1 auVar78 [32];
  undefined1 auVar89 [64];
  undefined1 auVar94 [64];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar46 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar67 = vpcmpeqd_avx(auVar46,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar46 = vpcmpeqd_avx(auVar46,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar59 = *(undefined1 (*) [32])(ray + 0x100);
    auVar72 = vcmpps_avx(auVar59,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar49._16_16_ = auVar46;
    auVar49._0_16_ = auVar67;
    local_5be0 = vandps_avx(auVar72,auVar49);
    uVar22 = vmovmskps_avx(local_5be0);
    if (uVar22 != 0) {
      _local_5b40 = *(undefined1 (*) [32])(ray + 0x80);
      _local_5b20 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5b00 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar76._0_4_ =
           local_5b40._0_4_ * local_5b40._0_4_ +
           local_5b00._0_4_ * local_5b00._0_4_ + local_5b20._0_4_ * local_5b20._0_4_;
      auVar76._4_4_ =
           local_5b40._4_4_ * local_5b40._4_4_ +
           local_5b00._4_4_ * local_5b00._4_4_ + local_5b20._4_4_ * local_5b20._4_4_;
      auVar76._8_4_ =
           local_5b40._8_4_ * local_5b40._8_4_ +
           local_5b00._8_4_ * local_5b00._8_4_ + local_5b20._8_4_ * local_5b20._8_4_;
      auVar76._12_4_ =
           local_5b40._12_4_ * local_5b40._12_4_ +
           local_5b00._12_4_ * local_5b00._12_4_ + local_5b20._12_4_ * local_5b20._12_4_;
      auVar76._16_4_ =
           local_5b40._16_4_ * local_5b40._16_4_ +
           local_5b00._16_4_ * local_5b00._16_4_ + local_5b20._16_4_ * local_5b20._16_4_;
      auVar76._20_4_ =
           local_5b40._20_4_ * local_5b40._20_4_ +
           local_5b00._20_4_ * local_5b00._20_4_ + local_5b20._20_4_ * local_5b20._20_4_;
      auVar76._24_4_ =
           local_5b40._24_4_ * local_5b40._24_4_ +
           local_5b00._24_4_ * local_5b00._24_4_ + local_5b20._24_4_ * local_5b20._24_4_;
      auVar76._28_4_ = in_register_0000135c + in_register_0000131c + in_register_0000135c;
      auVar72 = vrsqrtps_avx(auVar76);
      uVar23 = (ulong)(uVar22 & 0xff);
      fVar42 = auVar72._0_4_;
      fVar43 = auVar72._4_4_;
      fVar44 = auVar72._8_4_;
      fVar45 = auVar72._12_4_;
      fVar55 = auVar72._16_4_;
      fVar82 = auVar72._20_4_;
      fVar53 = auVar72._24_4_;
      local_59c0.v[0] = fVar42 * 1.5 + fVar42 * fVar42 * fVar42 * auVar76._0_4_ * -0.5;
      local_59c0.v[1] = fVar43 * 1.5 + fVar43 * fVar43 * fVar43 * auVar76._4_4_ * -0.5;
      local_59c0.v[2] = fVar44 * 1.5 + fVar44 * fVar44 * fVar44 * auVar76._8_4_ * -0.5;
      local_59c0.v[3] = fVar45 * 1.5 + fVar45 * fVar45 * fVar45 * auVar76._12_4_ * -0.5;
      local_59c0.v[4] = fVar55 * 1.5 + fVar55 * fVar55 * fVar55 * auVar76._16_4_ * -0.5;
      local_59c0.v[5] = fVar82 * 1.5 + fVar82 * fVar82 * fVar82 * auVar76._20_4_ * -0.5;
      local_59c0.v[6] = fVar53 * 1.5 + fVar53 * fVar53 * fVar53 * auVar76._24_4_ * -0.5;
      local_59c0.v[7] = auVar76._28_4_ + 1.5;
      auVar46._8_4_ = 0x80000000;
      auVar46._0_8_ = 0x8000000080000000;
      auVar46._12_4_ = 0x80000000;
      auVar67 = ZEXT816(0) << 0x20;
      do {
        lVar26 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
          }
        }
        auVar57 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar26 * 4 + 0x80)),
                                ZEXT416(*(uint *)(ray + lVar26 * 4 + 0xa0)),0x1c);
        auVar57 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(ray + lVar26 * 4 + 0xc0)),0x28);
        fVar42 = *(float *)((long)&local_59c0 + lVar26 * 4);
        auVar90._0_4_ = auVar57._0_4_ * fVar42;
        auVar90._4_4_ = auVar57._4_4_ * fVar42;
        auVar90._8_4_ = auVar57._8_4_ * fVar42;
        auVar90._12_4_ = auVar57._12_4_ * fVar42;
        auVar108 = vshufpd_avx(auVar90,auVar90,1);
        auVar57 = vmovshdup_avx(auVar90);
        auVar96 = vunpckhps_avx(auVar90,auVar67);
        auVar107._8_8_ = 0;
        auVar107._0_8_ = (ulong)auVar57._0_4_ ^ 0x80000000;
        auVar97 = vshufps_avx(auVar96,auVar107,0x41);
        auVar96._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
        auVar96._8_8_ = auVar108._8_8_ ^ auVar46._8_8_;
        auVar96 = vinsertps_avx(auVar96,auVar90,0x2a);
        auVar57 = vdpps_avx(auVar97,auVar97,0x7f);
        auVar108 = vdpps_avx(auVar96,auVar96,0x7f);
        auVar57 = vcmpps_avx(auVar108,auVar57,1);
        auVar57 = vshufps_avx(auVar57,auVar57,0);
        auVar57 = vblendvps_avx(auVar96,auVar97,auVar57);
        auVar108 = vdpps_avx(auVar57,auVar57,0x7f);
        auVar96 = vrsqrtss_avx(auVar108,auVar108);
        fVar43 = auVar96._0_4_;
        auVar108 = ZEXT416((uint)(fVar43 * 1.5 - auVar108._0_4_ * 0.5 * fVar43 * fVar43 * fVar43));
        auVar108 = vshufps_avx(auVar108,auVar108,0);
        auVar97._0_4_ = auVar57._0_4_ * auVar108._0_4_;
        auVar97._4_4_ = auVar57._4_4_ * auVar108._4_4_;
        auVar97._8_4_ = auVar57._8_4_ * auVar108._8_4_;
        auVar97._12_4_ = auVar57._12_4_ * auVar108._12_4_;
        auVar57 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar108 = vshufps_avx(auVar90,auVar90,0xc9);
        auVar118._0_4_ = auVar108._0_4_ * auVar97._0_4_;
        auVar118._4_4_ = auVar108._4_4_ * auVar97._4_4_;
        auVar118._8_4_ = auVar108._8_4_ * auVar97._8_4_;
        auVar118._12_4_ = auVar108._12_4_ * auVar97._12_4_;
        auVar108._0_4_ = auVar90._0_4_ * auVar57._0_4_;
        auVar108._4_4_ = auVar90._4_4_ * auVar57._4_4_;
        auVar108._8_4_ = auVar90._8_4_ * auVar57._8_4_;
        auVar108._12_4_ = auVar90._12_4_ * auVar57._12_4_;
        auVar57 = vsubps_avx(auVar108,auVar118);
        auVar96 = vshufps_avx(auVar57,auVar57,0xc9);
        auVar57 = vdpps_avx(auVar96,auVar96,0x7f);
        lVar26 = lVar26 * 0x30;
        auVar108 = vrsqrtss_avx(auVar57,auVar57);
        fVar43 = auVar108._0_4_;
        auVar130 = ZEXT464((uint)(fVar43 * 1.5));
        auVar57 = ZEXT416((uint)(fVar43 * 1.5 - auVar57._0_4_ * 0.5 * fVar43 * fVar43 * fVar43));
        auVar57 = vshufps_avx(auVar57,auVar57,0);
        auVar109._0_4_ = auVar57._0_4_ * auVar96._0_4_;
        auVar109._4_4_ = auVar57._4_4_ * auVar96._4_4_;
        auVar109._8_4_ = auVar57._8_4_ * auVar96._8_4_;
        auVar109._12_4_ = auVar57._12_4_ * auVar96._12_4_;
        auVar57._0_4_ = fVar42 * auVar90._0_4_;
        auVar57._4_4_ = fVar42 * auVar90._4_4_;
        auVar57._8_4_ = fVar42 * auVar90._8_4_;
        auVar57._12_4_ = fVar42 * auVar90._12_4_;
        auVar96 = vunpcklps_avx(auVar97,auVar57);
        auVar57 = vunpckhps_avx(auVar97,auVar57);
        auVar97 = vunpcklps_avx(auVar109,auVar67);
        auVar108 = vunpckhps_avx(auVar109,auVar67);
        auVar108 = vunpcklps_avx(auVar57,auVar108);
        auVar90 = vunpcklps_avx(auVar96,auVar97);
        auVar57 = vunpckhps_avx(auVar96,auVar97);
        *(undefined1 (*) [16])(local_59a0 + lVar26) = auVar90;
        *(undefined1 (*) [16])(auStack_5990 + lVar26) = auVar57;
        *(undefined1 (*) [16])(auStack_5980 + lVar26) = auVar108;
        uVar23 = uVar23 & uVar23 - 1;
      } while (uVar23 != 0);
      local_5ba0._0_4_ = (undefined4)*(undefined8 *)ray;
      local_5ba0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      local_5ba0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      local_5ba0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      local_5ba0._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      local_5ba0._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      local_5ba0._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      local_5ba0._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      local_5ba0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      local_5ba0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      local_5ba0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      local_5ba0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      local_5ba0._48_4_ = (undefined4)*(undefined8 *)(ray + 0x30);
      local_5ba0._52_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      local_5ba0._56_4_ = (undefined4)*(undefined8 *)(ray + 0x38);
      local_5ba0._60_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_5ba0._64_4_ = (undefined4)*(undefined8 *)(ray + 0x40);
      local_5ba0._68_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      local_5ba0._72_4_ = (undefined4)*(undefined8 *)(ray + 0x48);
      local_5ba0._76_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      local_5ba0._80_4_ = (undefined4)*(undefined8 *)(ray + 0x50);
      local_5ba0._84_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      local_5ba0._88_4_ = (undefined4)*(undefined8 *)(ray + 0x58);
      local_5ba0._92_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar83._16_4_ = 0x7fffffff;
      auVar83._20_4_ = 0x7fffffff;
      auVar83._24_4_ = 0x7fffffff;
      auVar83._28_4_ = 0x7fffffff;
      auVar87._8_4_ = 0x219392ef;
      auVar87._0_8_ = 0x219392ef219392ef;
      auVar87._12_4_ = 0x219392ef;
      auVar87._16_4_ = 0x219392ef;
      auVar87._20_4_ = 0x219392ef;
      auVar87._24_4_ = 0x219392ef;
      auVar87._28_4_ = 0x219392ef;
      auVar89 = ZEXT3264(auVar87);
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = &DAT_3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      auVar91._16_4_ = 0x3f800000;
      auVar91._20_4_ = 0x3f800000;
      auVar91._24_4_ = 0x3f800000;
      auVar91._28_4_ = 0x3f800000;
      auVar94 = ZEXT3264(auVar91);
      auVar69 = vdivps_avx(auVar91,_local_5b40);
      auVar72 = vandps_avx(_local_5b40,auVar83);
      auVar49 = vcmpps_avx(auVar72,auVar87,1);
      auVar72 = vandps_avx(_local_5b20,auVar83);
      auVar76 = vcmpps_avx(auVar72,auVar87,1);
      auVar70 = vdivps_avx(auVar91,_local_5b20);
      auVar72 = vandps_avx(_local_5b00,auVar83);
      auVar85._8_4_ = 0x5d5e0b6b;
      auVar85._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar85._12_4_ = 0x5d5e0b6b;
      auVar85._16_4_ = 0x5d5e0b6b;
      auVar85._20_4_ = 0x5d5e0b6b;
      auVar85._24_4_ = 0x5d5e0b6b;
      auVar85._28_4_ = 0x5d5e0b6b;
      _local_5ae0 = vblendvps_avx(auVar69,auVar85,auVar49);
      auVar72 = vcmpps_avx(auVar72,auVar87,1);
      auVar49 = vdivps_avx(auVar91,_local_5b00);
      local_5ac0 = vblendvps_avx(auVar70,auVar85,auVar76);
      local_5aa0 = vblendvps_avx(auVar49,auVar85,auVar72);
      auVar81 = ZEXT864(0) << 0x20;
      auVar72 = vcmpps_avx(_local_5ae0,ZEXT832(0) << 0x20,1);
      auVar69._8_4_ = 0x20;
      auVar69._0_8_ = 0x2000000020;
      auVar69._12_4_ = 0x20;
      auVar69._16_4_ = 0x20;
      auVar69._20_4_ = 0x20;
      auVar69._24_4_ = 0x20;
      auVar69._28_4_ = 0x20;
      local_5a80 = vandps_avx(auVar72,auVar69);
      auVar72 = vcmpps_avx(local_5ac0,ZEXT832(0) << 0x20,5);
      auVar70._8_4_ = 0x40;
      auVar70._0_8_ = 0x4000000040;
      auVar70._12_4_ = 0x40;
      auVar70._16_4_ = 0x40;
      auVar70._20_4_ = 0x40;
      auVar70._24_4_ = 0x40;
      auVar70._28_4_ = 0x40;
      auVar84._8_4_ = 0x60;
      auVar84._0_8_ = 0x6000000060;
      auVar84._12_4_ = 0x60;
      auVar84._16_4_ = 0x60;
      auVar84._20_4_ = 0x60;
      auVar84._24_4_ = 0x60;
      auVar84._28_4_ = 0x60;
      local_5a60 = vblendvps_avx(auVar84,auVar70,auVar72);
      auVar49 = ZEXT832(0) << 0x20;
      auVar72 = vcmpps_avx(local_5aa0,auVar49,5);
      auVar71._8_4_ = 0x80;
      auVar71._0_8_ = 0x8000000080;
      auVar71._12_4_ = 0x80;
      auVar71._16_4_ = 0x80;
      auVar71._20_4_ = 0x80;
      auVar71._24_4_ = 0x80;
      auVar71._28_4_ = 0x80;
      auVar77._8_4_ = 0xa0;
      auVar77._0_8_ = 0xa0000000a0;
      auVar77._12_4_ = 0xa0;
      auVar77._16_4_ = 0xa0;
      auVar77._20_4_ = 0xa0;
      auVar77._24_4_ = 0xa0;
      auVar77._28_4_ = 0xa0;
      local_5a40 = vblendvps_avx(auVar77,auVar71,auVar72);
      auVar72 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar49);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar99 = ZEXT3264(local_4680);
      auVar62 = ZEXT3264(local_5be0);
      local_5a20 = vblendvps_avx(local_4680,auVar72,local_5be0);
      auVar59 = vmaxps_avx(auVar59,auVar49);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      auVar72._16_4_ = 0xff800000;
      auVar72._20_4_ = 0xff800000;
      auVar72._24_4_ = 0xff800000;
      auVar72._28_4_ = 0xff800000;
      local_5a00._0_32_ = vblendvps_avx(auVar72,auVar59,local_5be0);
      auVar59 = vcmpps_avx(local_5a00._0_32_,local_5a00._0_32_,0xf);
      local_5c60._4_4_ = local_5be0._4_4_ ^ auVar59._4_4_;
      local_5c60._0_4_ = local_5be0._0_4_ ^ auVar59._0_4_;
      local_5c60._8_4_ = local_5be0._8_4_ ^ auVar59._8_4_;
      local_5c60._12_4_ = local_5be0._12_4_ ^ auVar59._12_4_;
      local_5c60._16_4_ = local_5be0._16_4_ ^ auVar59._16_4_;
      uStack_5c4c = local_5be0._20_4_ ^ auVar59._20_4_;
      uStack_5c48._0_4_ = local_5be0._24_4_ ^ auVar59._24_4_;
      uStack_5c48._4_4_ = local_5be0._28_4_ ^ auVar59._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        local_5c40 = 7;
      }
      else {
        local_5c40 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      puVar27 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar30 = (undefined1 (*) [32])local_4640;
      local_5808 = (bvh->root).ptr;
      local_4660 = local_5a20;
      local_5a00._32_8_ = mm_lookupmask_ps._16_8_;
      local_5a00._40_8_ = mm_lookupmask_ps._24_8_;
      local_5a00._48_8_ = mm_lookupmask_ps._16_8_;
      local_5a00._56_8_ = mm_lookupmask_ps._24_8_;
      auVar111 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                    CONCAT424(0x3f7ffffa,
                                              CONCAT420(0x3f7ffffa,
                                                        CONCAT416(0x3f7ffffa,
                                                                  CONCAT412(0x3f7ffffa,
                                                                            CONCAT48(0x3f7ffffa,
                                                                                                                                                                          
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar119 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
      do {
        auVar46 = auVar62._0_16_;
        pauVar30 = pauVar30 + -1;
        root.ptr = puVar27[-1];
        puVar27 = puVar27 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00491eb9:
          iVar25 = 3;
        }
        else {
          auVar59 = *pauVar30;
          auVar72 = vcmpps_avx(auVar59,local_5a00._0_32_,1);
          if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar72 >> 0x7f,0) == '\0') &&
                (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar72 >> 0xbf,0) == '\0') &&
              (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar72[0x1f]) {
            iVar25 = 2;
          }
          else {
            uVar28 = vmovmskps_avx(auVar72);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar28);
            iVar25 = 0;
            if ((uint)POPCOUNT(uVar28) <= local_5c40) {
              for (; unaff_R12 != 0; unaff_R12 = unaff_R12 & unaff_R12 - 1) {
                local_5c00 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> local_5c00 & 1) == 0; local_5c00 = local_5c00 + 1) {
                  }
                }
                auVar62 = ZEXT1664(auVar62._0_16_);
                auVar81 = ZEXT1664(auVar81._0_16_);
                auVar89 = ZEXT1664(auVar89._0_16_);
                auVar94 = ZEXT1664(auVar94._0_16_);
                auVar130 = ZEXT1664(auVar130._0_16_);
                local_5c20 = auVar59;
                bVar31 = occluded1(This,bvh,root,local_5c00,(Precalculations *)&local_59c0,ray,
                                   (TravRayK<8,_true> *)&local_5ba0.field_0,context);
                auVar46 = auVar62._0_16_;
                if (bVar31) {
                  *(undefined4 *)(local_5c60 + local_5c00 * 4) = 0xffffffff;
                }
                auVar99 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar111 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar119 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar59 = local_5c20;
              }
              auVar46 = vpcmpeqd_avx(auVar46,auVar46);
              auVar67 = vpcmpgtd_avx(stack0xffffffffffffa3b0,auVar46);
              auVar46 = vpcmpgtd_avx(local_5c60._0_16_,auVar46);
              auVar62 = ZEXT1664(auVar46);
              auVar46 = vpor_avx(auVar46,auVar67);
              iVar25 = 3;
              unaff_R12 = 0;
              if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar46[0xf] < '\0') {
                auVar61._8_4_ = 0xff800000;
                auVar61._0_8_ = 0xff800000ff800000;
                auVar61._12_4_ = 0xff800000;
                auVar61._16_4_ = 0xff800000;
                auVar61._20_4_ = 0xff800000;
                auVar61._24_4_ = 0xff800000;
                auVar61._28_4_ = 0xff800000;
                auVar62 = ZEXT3264(auVar61);
                local_5a00._0_32_ = vblendvps_avx(local_5a00._0_32_,auVar61,_local_5c60);
                iVar25 = 2;
              }
            }
            if ((uint)local_5c40 < (uint)POPCOUNT(uVar28)) {
              unaff_R12 = 8;
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar59 = vcmpps_avx(local_5a00._0_32_,auVar59,6);
                    if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar59 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar59 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar59 >> 0x7f,0) == '\0') &&
                          (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar59 >> 0xbf,0) == '\0') &&
                        (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar59[0x1f]) {
                      iVar25 = 2;
                    }
                    else {
                      local_5c00 = local_5c60._0_8_;
                      uStack_5bf8 = local_5c60._8_8_;
                      uStack_5bf0 = stack0xffffffffffffa3b0;
                      uStack_5be8 = uStack_5c48;
                      local_5bc0[0] = local_5a00._32_4_;
                      local_5bc0[1] = local_5a00._36_4_;
                      local_5bc0[2] = local_5a00._40_4_;
                      local_5bc0[3] = local_5a00._44_4_;
                      local_5bc0[4] = local_5a00._48_4_;
                      local_5bc0[5] = local_5a00._52_4_;
                      local_5bc0[6] = local_5a00._56_4_;
                      local_5bc0[7] = local_5a00._60_4_;
                      auVar46 = vpcmpeqd_avx(auVar62._0_16_,auVar62._0_16_);
                      auVar62 = ZEXT1664(auVar46);
                      auVar67 = vpcmpgtd_avx(stack0xffffffffffffa3b0,auVar46);
                      auVar57 = vpcmpgtd_avx(local_5c60._0_16_,auVar46);
                      auVar41._16_16_ = auVar67;
                      auVar41._0_16_ = auVar57;
                      iVar25 = vmovmskps_avx(auVar41);
                      if (iVar25 != 0) {
                        uVar23 = (ulong)(byte)iVar25;
                        local_5c20._0_8_ =
                             (long)This->leafIntersector +
                             (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x28;
                        do {
                          lVar26 = 0;
                          if (uVar23 != 0) {
                            for (; (uVar23 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                            }
                          }
                          auVar62 = ZEXT1664(auVar62._0_16_);
                          auVar81 = ZEXT1664(auVar81._0_16_);
                          auVar89 = ZEXT1664(auVar89._0_16_);
                          auVar94 = ZEXT1664(auVar94._0_16_);
                          auVar130 = ZEXT1664(auVar130._0_16_);
                          cVar21 = (**(code **)local_5c20._0_8_)
                                             (&local_59c0,ray,lVar26,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          auVar46 = auVar62._0_16_;
                          if (cVar21 != '\0') {
                            local_5bc0[lVar26] = 0xffffffff;
                          }
                          uVar23 = uVar23 & uVar23 - 1;
                        } while (uVar23 != 0);
                      }
                      auVar16._8_8_ = uStack_5bf8;
                      auVar16._0_8_ = local_5c00;
                      auVar16._16_8_ = uStack_5bf0;
                      auVar16._24_8_ = uStack_5be8;
                      auVar17._8_4_ = local_5bc0[2];
                      auVar17._12_4_ = local_5bc0[3];
                      auVar17._0_4_ = local_5bc0[0];
                      auVar17._4_4_ = local_5bc0[1];
                      auVar17._16_4_ = local_5bc0[4];
                      auVar17._20_4_ = local_5bc0[5];
                      auVar17._24_4_ = local_5bc0[6];
                      auVar17._28_4_ = local_5bc0[7];
                      _local_5c60 = vorps_avx(auVar16,auVar17);
                      auVar46 = vpcmpeqd_avx(auVar46,auVar46);
                      auVar67 = vpcmpgtd_avx(local_5c60._16_16_,auVar46);
                      auVar46 = vpcmpgtd_avx(local_5c60._0_16_,auVar46);
                      auVar62 = ZEXT1664(auVar46);
                      auVar46 = vpor_avx(auVar46,auVar67);
                      if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar46[0xf]) {
                        iVar25 = 3;
                      }
                      else {
                        auVar60._8_4_ = 0xff800000;
                        auVar60._0_8_ = 0xff800000ff800000;
                        auVar60._12_4_ = 0xff800000;
                        auVar60._16_4_ = 0xff800000;
                        auVar60._20_4_ = 0xff800000;
                        auVar60._24_4_ = 0xff800000;
                        auVar60._28_4_ = 0xff800000;
                        auVar62 = ZEXT3264(auVar60);
                        local_5a00._0_32_ = vblendvps_avx(local_5a00._0_32_,auVar60,_local_5c60);
                        iVar25 = 0;
                      }
                    }
                    unaff_R12 = 0;
                    auVar99 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar111 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                  CONCAT424(0x3f7ffffa,
                                                            CONCAT420(0x3f7ffffa,
                                                                      CONCAT416(0x3f7ffffa,
                                                                                CONCAT412(0x3f7ffffa
                                                                                          ,CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                    auVar119 = ZEXT3264(CONCAT428(0x3f800003,
                                                  CONCAT424(0x3f800003,
                                                            CONCAT420(0x3f800003,
                                                                      CONCAT416(0x3f800003,
                                                                                CONCAT412(0x3f800003
                                                                                          ,CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                    break;
                  }
                  goto LAB_00491eb9;
                }
                uVar24 = root.ptr & 0xfffffffffffffff0;
                auVar123 = ZEXT3264(auVar99._0_32_);
                uVar23 = 0;
                uVar29 = unaff_R12;
                do {
                  uVar4 = *(ulong *)(uVar24 + uVar23 * 8);
                  if (uVar4 != 8) {
                    auVar62._28_36_ = auVar81._28_36_;
                    auVar81._28_36_ = auVar89._28_36_;
                    auVar89._28_36_ = auVar94._28_36_;
                    if ((root.ptr & 7) == 0) {
                      uVar28 = *(undefined4 *)(root.ptr + 0x40 + uVar23 * 4);
                      auVar35._4_4_ = uVar28;
                      auVar35._0_4_ = uVar28;
                      auVar35._8_4_ = uVar28;
                      auVar35._12_4_ = uVar28;
                      auVar35._16_4_ = uVar28;
                      auVar35._20_4_ = uVar28;
                      auVar35._24_4_ = uVar28;
                      auVar35._28_4_ = uVar28;
                      auVar18._4_4_ = local_5ba0._4_4_;
                      auVar18._0_4_ = local_5ba0._0_4_;
                      auVar18._8_4_ = local_5ba0._8_4_;
                      auVar18._12_4_ = local_5ba0._12_4_;
                      auVar18._16_4_ = local_5ba0._16_4_;
                      auVar18._20_4_ = local_5ba0._20_4_;
                      auVar18._24_4_ = local_5ba0._24_4_;
                      auVar18._28_4_ = local_5ba0._28_4_;
                      auVar19._4_4_ = local_5ba0._36_4_;
                      auVar19._0_4_ = local_5ba0._32_4_;
                      auVar19._8_4_ = local_5ba0._40_4_;
                      auVar19._12_4_ = local_5ba0._44_4_;
                      auVar19._16_4_ = local_5ba0._48_4_;
                      auVar19._20_4_ = local_5ba0._52_4_;
                      auVar19._24_4_ = local_5ba0._56_4_;
                      auVar19._28_4_ = local_5ba0._60_4_;
                      auVar20._4_4_ = local_5ba0._68_4_;
                      auVar20._0_4_ = local_5ba0._64_4_;
                      auVar20._8_4_ = local_5ba0._72_4_;
                      auVar20._12_4_ = local_5ba0._76_4_;
                      auVar20._16_4_ = local_5ba0._80_4_;
                      auVar20._20_4_ = local_5ba0._84_4_;
                      auVar20._24_4_ = local_5ba0._88_4_;
                      auVar20._28_4_ = local_5ba0._92_4_;
                      auVar59 = vsubps_avx(auVar35,auVar18);
                      auVar62._0_4_ = (float)local_5ae0._0_4_ * auVar59._0_4_;
                      auVar62._4_4_ = (float)local_5ae0._4_4_ * auVar59._4_4_;
                      auVar62._8_4_ = fStack_5ad8 * auVar59._8_4_;
                      auVar62._12_4_ = fStack_5ad4 * auVar59._12_4_;
                      auVar62._16_4_ = fStack_5ad0 * auVar59._16_4_;
                      auVar62._20_4_ = fStack_5acc * auVar59._20_4_;
                      auVar62._24_4_ = fStack_5ac8 * auVar59._24_4_;
                      auVar80 = auVar62._0_32_;
                      uVar28 = *(undefined4 *)(root.ptr + 0x80 + uVar23 * 4);
                      auVar36._4_4_ = uVar28;
                      auVar36._0_4_ = uVar28;
                      auVar36._8_4_ = uVar28;
                      auVar36._12_4_ = uVar28;
                      auVar36._16_4_ = uVar28;
                      auVar36._20_4_ = uVar28;
                      auVar36._24_4_ = uVar28;
                      auVar36._28_4_ = uVar28;
                      auVar59 = vsubps_avx(auVar36,auVar19);
                      uVar28 = *(undefined4 *)(root.ptr + 0xc0 + uVar23 * 4);
                      auVar86._4_4_ = uVar28;
                      auVar86._0_4_ = uVar28;
                      auVar86._8_4_ = uVar28;
                      auVar86._12_4_ = uVar28;
                      auVar86._16_4_ = uVar28;
                      auVar86._20_4_ = uVar28;
                      auVar86._24_4_ = uVar28;
                      auVar86._28_4_ = uVar28;
                      auVar81._0_4_ = local_5ac0._0_4_ * auVar59._0_4_;
                      auVar81._4_4_ = local_5ac0._4_4_ * auVar59._4_4_;
                      auVar81._8_4_ = local_5ac0._8_4_ * auVar59._8_4_;
                      auVar81._12_4_ = local_5ac0._12_4_ * auVar59._12_4_;
                      auVar81._16_4_ = local_5ac0._16_4_ * auVar59._16_4_;
                      auVar81._20_4_ = local_5ac0._20_4_ * auVar59._20_4_;
                      auVar81._24_4_ = local_5ac0._24_4_ * auVar59._24_4_;
                      auVar88 = auVar81._0_32_;
                      auVar59 = vsubps_avx(auVar86,auVar20);
                      auVar89._0_4_ = local_5aa0._0_4_ * auVar59._0_4_;
                      auVar89._4_4_ = local_5aa0._4_4_ * auVar59._4_4_;
                      auVar89._8_4_ = local_5aa0._8_4_ * auVar59._8_4_;
                      auVar89._12_4_ = local_5aa0._12_4_ * auVar59._12_4_;
                      auVar89._16_4_ = local_5aa0._16_4_ * auVar59._16_4_;
                      auVar89._20_4_ = local_5aa0._20_4_ * auVar59._20_4_;
                      auVar89._24_4_ = local_5aa0._24_4_ * auVar59._24_4_;
                      auVar49 = auVar89._0_32_;
                      auVar94 = ZEXT3264(auVar49);
                      uVar28 = *(undefined4 *)(root.ptr + 0x60 + uVar23 * 4);
                      auVar37._4_4_ = uVar28;
                      auVar37._0_4_ = uVar28;
                      auVar37._8_4_ = uVar28;
                      auVar37._12_4_ = uVar28;
                      auVar37._16_4_ = uVar28;
                      auVar37._20_4_ = uVar28;
                      auVar37._24_4_ = uVar28;
                      auVar37._28_4_ = uVar28;
                      auVar59 = vsubps_avx(auVar37,auVar18);
                      auVar5._4_4_ = (float)local_5ae0._4_4_ * auVar59._4_4_;
                      auVar5._0_4_ = (float)local_5ae0._0_4_ * auVar59._0_4_;
                      auVar5._8_4_ = fStack_5ad8 * auVar59._8_4_;
                      auVar5._12_4_ = fStack_5ad4 * auVar59._12_4_;
                      auVar5._16_4_ = fStack_5ad0 * auVar59._16_4_;
                      auVar5._20_4_ = fStack_5acc * auVar59._20_4_;
                      auVar5._24_4_ = fStack_5ac8 * auVar59._24_4_;
                      auVar5._28_4_ = local_5ba0._28_4_;
                      uVar28 = *(undefined4 *)(root.ptr + 0xa0 + uVar23 * 4);
                      auVar38._4_4_ = uVar28;
                      auVar38._0_4_ = uVar28;
                      auVar38._8_4_ = uVar28;
                      auVar38._12_4_ = uVar28;
                      auVar38._16_4_ = uVar28;
                      auVar38._20_4_ = uVar28;
                      auVar38._24_4_ = uVar28;
                      auVar38._28_4_ = uVar28;
                      auVar59 = vsubps_avx(auVar38,auVar19);
                      auVar6._4_4_ = local_5ac0._4_4_ * auVar59._4_4_;
                      auVar6._0_4_ = local_5ac0._0_4_ * auVar59._0_4_;
                      auVar6._8_4_ = local_5ac0._8_4_ * auVar59._8_4_;
                      auVar6._12_4_ = local_5ac0._12_4_ * auVar59._12_4_;
                      auVar6._16_4_ = local_5ac0._16_4_ * auVar59._16_4_;
                      auVar6._20_4_ = local_5ac0._20_4_ * auVar59._20_4_;
                      auVar6._24_4_ = local_5ac0._24_4_ * auVar59._24_4_;
                      auVar6._28_4_ = local_5ba0._60_4_;
                      uVar28 = *(undefined4 *)(root.ptr + 0xe0 + uVar23 * 4);
                      auVar39._4_4_ = uVar28;
                      auVar39._0_4_ = uVar28;
                      auVar39._8_4_ = uVar28;
                      auVar39._12_4_ = uVar28;
                      auVar39._16_4_ = uVar28;
                      auVar39._20_4_ = uVar28;
                      auVar39._24_4_ = uVar28;
                      auVar39._28_4_ = uVar28;
                      auVar59 = vsubps_avx(auVar39,auVar20);
                      auVar7._4_4_ = local_5aa0._4_4_ * auVar59._4_4_;
                      auVar7._0_4_ = local_5aa0._0_4_ * auVar59._0_4_;
                      auVar7._8_4_ = local_5aa0._8_4_ * auVar59._8_4_;
                      auVar7._12_4_ = local_5aa0._12_4_ * auVar59._12_4_;
                      auVar7._16_4_ = local_5aa0._16_4_ * auVar59._16_4_;
                      auVar7._20_4_ = local_5aa0._20_4_ * auVar59._20_4_;
                      auVar7._24_4_ = local_5aa0._24_4_ * auVar59._24_4_;
                      auVar7._28_4_ = local_5ba0._92_4_;
                      auVar59 = vminps_avx(auVar80,auVar5);
                      auVar72 = vminps_avx(auVar88,auVar6);
                      auVar59 = vmaxps_avx(auVar59,auVar72);
                      auVar72 = vminps_avx(auVar49,auVar7);
                      auVar59 = vmaxps_avx(auVar59,auVar72);
                      auVar40._4_4_ = auVar111._4_4_ * auVar59._4_4_;
                      auVar40._0_4_ = auVar111._0_4_ * auVar59._0_4_;
                      auVar40._8_4_ = auVar111._8_4_ * auVar59._8_4_;
                      auVar40._12_4_ = auVar111._12_4_ * auVar59._12_4_;
                      auVar40._16_4_ = auVar111._16_4_ * auVar59._16_4_;
                      auVar40._20_4_ = auVar111._20_4_ * auVar59._20_4_;
                      auVar40._24_4_ = auVar111._24_4_ * auVar59._24_4_;
                      auVar40._28_4_ = auVar59._28_4_;
                      auVar59 = vmaxps_avx(auVar80,auVar5);
                      auVar72 = vmaxps_avx(auVar88,auVar6);
                      auVar72 = vminps_avx(auVar59,auVar72);
                      auVar59 = vmaxps_avx(auVar49,auVar7);
                      auVar59 = vminps_avx(auVar72,auVar59);
                      auVar8._4_4_ = auVar119._4_4_ * auVar59._4_4_;
                      auVar8._0_4_ = auVar119._0_4_ * auVar59._0_4_;
                      auVar8._8_4_ = auVar119._8_4_ * auVar59._8_4_;
                      auVar8._12_4_ = auVar119._12_4_ * auVar59._12_4_;
                      auVar8._16_4_ = auVar119._16_4_ * auVar59._16_4_;
                      auVar8._20_4_ = auVar119._20_4_ * auVar59._20_4_;
                      auVar8._24_4_ = auVar119._24_4_ * auVar59._24_4_;
                      auVar8._28_4_ = auVar59._28_4_;
                      auVar59 = vmaxps_avx(auVar40,local_5a20);
                      auVar51 = vminps_avx(auVar8,local_5a00._0_32_);
                    }
                    else {
                      fVar42 = *(float *)(uVar24 + 0x40 + uVar23 * 4);
                      fVar43 = *(float *)(uVar24 + 0x60 + uVar23 * 4);
                      fVar44 = *(float *)(uVar24 + 0x80 + uVar23 * 4);
                      fVar45 = *(float *)(uVar24 + 0xa0 + uVar23 * 4);
                      fVar55 = *(float *)(uVar24 + 0xc0 + uVar23 * 4);
                      fVar82 = *(float *)(uVar24 + 0xe0 + uVar23 * 4);
                      fVar53 = *(float *)(uVar24 + 0x100 + uVar23 * 4);
                      fVar1 = *(float *)(uVar24 + 0x120 + uVar23 * 4);
                      fVar2 = *(float *)(uVar24 + 0x140 + uVar23 * 4);
                      fStack_5c38 = *(float *)(uVar24 + 0x160 + uVar23 * 4);
                      local_5c20 = auVar123._0_32_;
                      fVar120 = auVar130._28_4_ + auVar119._28_4_;
                      auVar110._0_4_ =
                           (float)local_5b40._0_4_ * fVar42 +
                           (float)local_5b20._0_4_ * fVar45 + fVar53 * (float)local_5b00._0_4_;
                      auVar110._4_4_ =
                           (float)local_5b40._4_4_ * fVar42 +
                           (float)local_5b20._4_4_ * fVar45 + fVar53 * (float)local_5b00._4_4_;
                      auVar110._8_4_ =
                           fStack_5b38 * fVar42 + fStack_5b18 * fVar45 + fVar53 * fStack_5af8;
                      auVar110._12_4_ =
                           fStack_5b34 * fVar42 + fStack_5b14 * fVar45 + fVar53 * fStack_5af4;
                      auVar110._16_4_ =
                           fStack_5b30 * fVar42 + fStack_5b10 * fVar45 + fVar53 * fStack_5af0;
                      auVar110._20_4_ =
                           fStack_5b2c * fVar42 + fStack_5b0c * fVar45 + fVar53 * fStack_5aec;
                      auVar110._24_4_ =
                           fStack_5b28 * fVar42 + fStack_5b08 * fVar45 + fVar53 * fStack_5ae8;
                      auVar110._28_4_ = fStack_5ae4 + fVar120;
                      auVar122._0_4_ =
                           (float)local_5b40._0_4_ * fVar43 +
                           (float)local_5b20._0_4_ * fVar55 + (float)local_5b00._0_4_ * fVar1;
                      auVar122._4_4_ =
                           (float)local_5b40._4_4_ * fVar43 +
                           (float)local_5b20._4_4_ * fVar55 + (float)local_5b00._4_4_ * fVar1;
                      auVar122._8_4_ =
                           fStack_5b38 * fVar43 + fStack_5b18 * fVar55 + fStack_5af8 * fVar1;
                      auVar122._12_4_ =
                           fStack_5b34 * fVar43 + fStack_5b14 * fVar55 + fStack_5af4 * fVar1;
                      auVar122._16_4_ =
                           fStack_5b30 * fVar43 + fStack_5b10 * fVar55 + fStack_5af0 * fVar1;
                      auVar122._20_4_ =
                           fStack_5b2c * fVar43 + fStack_5b0c * fVar55 + fStack_5aec * fVar1;
                      auVar122._24_4_ =
                           fStack_5b28 * fVar43 + fStack_5b08 * fVar55 + fStack_5ae8 * fVar1;
                      auVar122._28_4_ = fVar120 + auVar130._28_4_ + auVar123._28_4_;
                      fVar120 = *(float *)(uVar24 + 0x180 + uVar23 * 4);
                      auVar98._0_4_ =
                           (float)local_5b40._0_4_ * fVar44 +
                           (float)local_5b20._0_4_ * fVar82 + (float)local_5b00._0_4_ * fVar2;
                      auVar98._4_4_ =
                           (float)local_5b40._4_4_ * fVar44 +
                           (float)local_5b20._4_4_ * fVar82 + (float)local_5b00._4_4_ * fVar2;
                      auVar98._8_4_ =
                           fStack_5b38 * fVar44 + fStack_5b18 * fVar82 + fStack_5af8 * fVar2;
                      auVar98._12_4_ =
                           fStack_5b34 * fVar44 + fStack_5b14 * fVar82 + fStack_5af4 * fVar2;
                      auVar98._16_4_ =
                           fStack_5b30 * fVar44 + fStack_5b10 * fVar82 + fStack_5af0 * fVar2;
                      auVar98._20_4_ =
                           fStack_5b2c * fVar44 + fStack_5b0c * fVar82 + fStack_5aec * fVar2;
                      auVar98._24_4_ =
                           fStack_5b28 * fVar44 + fStack_5b08 * fVar82 + fStack_5ae8 * fVar2;
                      auVar98._28_4_ = fStack_5b24 + fStack_5b04 + fStack_5ae4;
                      auVar131._8_4_ = 0x7fffffff;
                      auVar131._0_8_ = 0x7fffffff7fffffff;
                      auVar131._12_4_ = 0x7fffffff;
                      auVar131._16_4_ = 0x7fffffff;
                      auVar131._20_4_ = 0x7fffffff;
                      auVar131._24_4_ = 0x7fffffff;
                      auVar131._28_4_ = 0x7fffffff;
                      auVar59 = vandps_avx(auVar110,auVar131);
                      auVar92._8_4_ = 0x219392ef;
                      auVar92._0_8_ = 0x219392ef219392ef;
                      auVar92._12_4_ = 0x219392ef;
                      auVar92._16_4_ = 0x219392ef;
                      auVar92._20_4_ = 0x219392ef;
                      auVar92._24_4_ = 0x219392ef;
                      auVar92._28_4_ = 0x219392ef;
                      auVar59 = vcmpps_avx(auVar59,auVar92,1);
                      auVar72 = vblendvps_avx(auVar110,auVar92,auVar59);
                      auVar59 = vandps_avx(auVar122,auVar131);
                      auVar59 = vcmpps_avx(auVar59,auVar92,1);
                      auVar49 = vblendvps_avx(auVar122,auVar92,auVar59);
                      auVar59 = vandps_avx(auVar98,auVar131);
                      auVar59 = vcmpps_avx(auVar59,auVar92,1);
                      auVar59 = vblendvps_avx(auVar98,auVar92,auVar59);
                      auVar76 = vrcpps_avx(auVar72);
                      fVar95 = auVar76._0_4_;
                      fVar100 = auVar76._4_4_;
                      auVar9._4_4_ = fVar100 * auVar72._4_4_;
                      auVar9._0_4_ = fVar95 * auVar72._0_4_;
                      fVar101 = auVar76._8_4_;
                      auVar9._8_4_ = fVar101 * auVar72._8_4_;
                      fVar102 = auVar76._12_4_;
                      auVar9._12_4_ = fVar102 * auVar72._12_4_;
                      fVar103 = auVar76._16_4_;
                      auVar9._16_4_ = fVar103 * auVar72._16_4_;
                      fVar104 = auVar76._20_4_;
                      auVar9._20_4_ = fVar104 * auVar72._20_4_;
                      fVar105 = auVar76._24_4_;
                      auVar9._24_4_ = fVar105 * auVar72._24_4_;
                      auVar9._28_4_ = auVar72._28_4_;
                      auVar93._8_4_ = 0x3f800000;
                      auVar93._0_8_ = &DAT_3f8000003f800000;
                      auVar93._12_4_ = 0x3f800000;
                      auVar93._16_4_ = 0x3f800000;
                      auVar93._20_4_ = 0x3f800000;
                      auVar93._24_4_ = 0x3f800000;
                      auVar93._28_4_ = 0x3f800000;
                      auVar69 = vsubps_avx(auVar93,auVar9);
                      fVar95 = fVar95 + fVar95 * auVar69._0_4_;
                      fVar100 = fVar100 + fVar100 * auVar69._4_4_;
                      fVar101 = fVar101 + fVar101 * auVar69._8_4_;
                      fVar102 = fVar102 + fVar102 * auVar69._12_4_;
                      fVar103 = fVar103 + fVar103 * auVar69._16_4_;
                      fVar104 = fVar104 + fVar104 * auVar69._20_4_;
                      fVar105 = fVar105 + fVar105 * auVar69._24_4_;
                      auVar72 = vrcpps_avx(auVar49);
                      fVar106 = auVar72._0_4_;
                      fVar112 = auVar72._4_4_;
                      auVar10._4_4_ = fVar112 * auVar49._4_4_;
                      auVar10._0_4_ = fVar106 * auVar49._0_4_;
                      fVar113 = auVar72._8_4_;
                      auVar10._8_4_ = fVar113 * auVar49._8_4_;
                      fVar114 = auVar72._12_4_;
                      auVar10._12_4_ = fVar114 * auVar49._12_4_;
                      fVar115 = auVar72._16_4_;
                      auVar10._16_4_ = fVar115 * auVar49._16_4_;
                      fVar116 = auVar72._20_4_;
                      auVar10._20_4_ = fVar116 * auVar49._20_4_;
                      fVar117 = auVar72._24_4_;
                      auVar10._24_4_ = fVar117 * auVar49._24_4_;
                      auVar10._28_4_ = auVar49._28_4_;
                      auVar70 = vsubps_avx(auVar93,auVar10);
                      fVar106 = fVar106 + fVar106 * auVar70._0_4_;
                      fVar112 = fVar112 + fVar112 * auVar70._4_4_;
                      fVar113 = fVar113 + fVar113 * auVar70._8_4_;
                      fVar114 = fVar114 + fVar114 * auVar70._12_4_;
                      fVar115 = fVar115 + fVar115 * auVar70._16_4_;
                      fVar116 = fVar116 + fVar116 * auVar70._20_4_;
                      fVar117 = fVar117 + fVar117 * auVar70._24_4_;
                      auVar49 = vrcpps_avx(auVar59);
                      fVar121 = auVar49._0_4_;
                      fVar124 = auVar49._4_4_;
                      auVar11._4_4_ = fVar124 * auVar59._4_4_;
                      auVar11._0_4_ = fVar121 * auVar59._0_4_;
                      fVar125 = auVar49._8_4_;
                      auVar11._8_4_ = fVar125 * auVar59._8_4_;
                      fVar126 = auVar49._12_4_;
                      auVar11._12_4_ = fVar126 * auVar59._12_4_;
                      fVar127 = auVar49._16_4_;
                      auVar11._16_4_ = fVar127 * auVar59._16_4_;
                      fVar128 = auVar49._20_4_;
                      auVar11._20_4_ = fVar128 * auVar59._20_4_;
                      fVar129 = auVar49._24_4_;
                      auVar11._24_4_ = fVar129 * auVar59._24_4_;
                      auVar11._28_4_ = auVar59._28_4_;
                      auVar59 = vsubps_avx(auVar93,auVar11);
                      fVar121 = fVar121 + fVar121 * auVar59._0_4_;
                      fVar124 = fVar124 + fVar124 * auVar59._4_4_;
                      fVar125 = fVar125 + fVar125 * auVar59._8_4_;
                      fVar126 = fVar126 + fVar126 * auVar59._12_4_;
                      fVar127 = fVar127 + fVar127 * auVar59._16_4_;
                      fVar128 = fVar128 + fVar128 * auVar59._20_4_;
                      fVar129 = fVar129 + fVar129 * auVar59._24_4_;
                      fVar3 = *(float *)(uVar24 + 0x1a0 + uVar23 * 4);
                      fVar66 = fVar42 + fVar53 + fStack_5c38 + fVar45;
                      auVar58._0_4_ =
                           -fVar95 * ((float)local_5ba0._0_4_ * fVar42 +
                                     fVar53 * (float)local_5ba0._64_4_ + fStack_5c38 +
                                     (float)local_5ba0._32_4_ * fVar45);
                      auVar58._4_4_ =
                           -fVar100 *
                           ((float)local_5ba0._4_4_ * fVar42 +
                           fVar53 * (float)local_5ba0._68_4_ + fStack_5c38 +
                           (float)local_5ba0._36_4_ * fVar45);
                      auVar58._8_4_ =
                           -fVar101 *
                           ((float)local_5ba0._8_4_ * fVar42 +
                           fVar53 * (float)local_5ba0._72_4_ + fStack_5c38 +
                           (float)local_5ba0._40_4_ * fVar45);
                      auVar58._12_4_ =
                           -fVar102 *
                           ((float)local_5ba0._12_4_ * fVar42 +
                           fVar53 * (float)local_5ba0._76_4_ + fStack_5c38 +
                           (float)local_5ba0._44_4_ * fVar45);
                      fVar63 = -fVar103 *
                               ((float)local_5ba0._16_4_ * fVar42 +
                               fVar53 * (float)local_5ba0._80_4_ + fStack_5c38 +
                               (float)local_5ba0._48_4_ * fVar45);
                      auVar12._16_4_ = fVar63;
                      auVar12._0_16_ = auVar58;
                      fVar64 = -fVar104 *
                               ((float)local_5ba0._20_4_ * fVar42 +
                               fVar53 * (float)local_5ba0._84_4_ + fStack_5c38 +
                               (float)local_5ba0._52_4_ * fVar45);
                      auVar12._20_4_ = fVar64;
                      fVar65 = -fVar105 *
                               ((float)local_5ba0._24_4_ * fVar42 +
                               fVar53 * (float)local_5ba0._88_4_ + fStack_5c38 +
                               (float)local_5ba0._56_4_ * fVar45);
                      auVar12._24_4_ = fVar65;
                      auVar12._28_4_ = fVar66;
                      fVar56 = fVar43 + fVar55 + fVar120 + fVar1;
                      auVar47._0_4_ =
                           -fVar106 *
                           ((float)local_5ba0._0_4_ * fVar43 +
                           (float)local_5ba0._32_4_ * fVar55 +
                           fVar120 + (float)local_5ba0._64_4_ * fVar1);
                      auVar47._4_4_ =
                           -fVar112 *
                           ((float)local_5ba0._4_4_ * fVar43 +
                           (float)local_5ba0._36_4_ * fVar55 +
                           fVar120 + (float)local_5ba0._68_4_ * fVar1);
                      auVar47._8_4_ =
                           -fVar113 *
                           ((float)local_5ba0._8_4_ * fVar43 +
                           (float)local_5ba0._40_4_ * fVar55 +
                           fVar120 + (float)local_5ba0._72_4_ * fVar1);
                      auVar47._12_4_ =
                           -fVar114 *
                           ((float)local_5ba0._12_4_ * fVar43 +
                           (float)local_5ba0._44_4_ * fVar55 +
                           fVar120 + (float)local_5ba0._76_4_ * fVar1);
                      fVar53 = -fVar115 *
                               ((float)local_5ba0._16_4_ * fVar43 +
                               (float)local_5ba0._48_4_ * fVar55 +
                               fVar120 + (float)local_5ba0._80_4_ * fVar1);
                      auVar13._16_4_ = fVar53;
                      auVar13._0_16_ = auVar47;
                      fVar54 = -fVar116 *
                               ((float)local_5ba0._20_4_ * fVar43 +
                               (float)local_5ba0._52_4_ * fVar55 +
                               fVar120 + (float)local_5ba0._84_4_ * fVar1);
                      auVar13._20_4_ = fVar54;
                      fVar55 = -fVar117 *
                               ((float)local_5ba0._24_4_ * fVar43 +
                               (float)local_5ba0._56_4_ * fVar55 +
                               fVar120 + (float)local_5ba0._88_4_ * fVar1);
                      auVar13._24_4_ = fVar55;
                      auVar13._28_4_ = fVar56;
                      fVar45 = fVar44 + fVar82 + fVar3 + fVar2;
                      auVar32._0_4_ =
                           ((float)local_5ba0._0_4_ * fVar44 +
                           (float)local_5ba0._32_4_ * fVar82 +
                           fVar3 + (float)local_5ba0._64_4_ * fVar2) * -fVar121;
                      auVar32._4_4_ =
                           ((float)local_5ba0._4_4_ * fVar44 +
                           (float)local_5ba0._36_4_ * fVar82 +
                           fVar3 + (float)local_5ba0._68_4_ * fVar2) * -fVar124;
                      auVar32._8_4_ =
                           ((float)local_5ba0._8_4_ * fVar44 +
                           (float)local_5ba0._40_4_ * fVar82 +
                           fVar3 + (float)local_5ba0._72_4_ * fVar2) * -fVar125;
                      auVar32._12_4_ =
                           ((float)local_5ba0._12_4_ * fVar44 +
                           (float)local_5ba0._44_4_ * fVar82 +
                           fVar3 + (float)local_5ba0._76_4_ * fVar2) * -fVar126;
                      fVar42 = ((float)local_5ba0._16_4_ * fVar44 +
                               (float)local_5ba0._48_4_ * fVar82 +
                               fVar3 + (float)local_5ba0._80_4_ * fVar2) * -fVar127;
                      auVar14._16_4_ = fVar42;
                      auVar14._0_16_ = auVar32;
                      fVar43 = ((float)local_5ba0._20_4_ * fVar44 +
                               (float)local_5ba0._52_4_ * fVar82 +
                               fVar3 + (float)local_5ba0._84_4_ * fVar2) * -fVar128;
                      auVar14._20_4_ = fVar43;
                      fVar44 = ((float)local_5ba0._24_4_ * fVar44 +
                               (float)local_5ba0._56_4_ * fVar82 +
                               fVar3 + (float)local_5ba0._88_4_ * fVar2) * -fVar129;
                      auVar14._24_4_ = fVar44;
                      auVar14._28_4_ = fVar45;
                      auVar68._0_4_ = fVar95 + auVar58._0_4_;
                      auVar68._4_4_ = fVar100 + auVar58._4_4_;
                      auVar68._8_4_ = fVar101 + auVar58._8_4_;
                      auVar68._12_4_ = fVar102 + auVar58._12_4_;
                      auVar74._16_4_ = fVar103 + fVar63;
                      auVar74._0_16_ = auVar68;
                      auVar74._20_4_ = fVar104 + fVar64;
                      auVar74._24_4_ = fVar105 + fVar65;
                      auVar74._28_4_ = auVar76._28_4_ + auVar69._28_4_ + fVar66;
                      auVar75._0_4_ = fVar106 + auVar47._0_4_;
                      auVar75._4_4_ = fVar112 + auVar47._4_4_;
                      auVar75._8_4_ = fVar113 + auVar47._8_4_;
                      auVar75._12_4_ = fVar114 + auVar47._12_4_;
                      auVar78._16_4_ = fVar115 + fVar53;
                      auVar78._0_16_ = auVar75;
                      auVar78._20_4_ = fVar116 + fVar54;
                      auVar78._24_4_ = fVar117 + fVar55;
                      auVar78._28_4_ = auVar72._28_4_ + auVar70._28_4_ + fVar56;
                      auVar79._0_4_ = fVar121 + auVar32._0_4_;
                      auVar79._4_4_ = fVar124 + auVar32._4_4_;
                      auVar79._8_4_ = fVar125 + auVar32._8_4_;
                      auVar79._12_4_ = fVar126 + auVar32._12_4_;
                      auVar80._16_4_ = fVar127 + fVar42;
                      auVar80._0_16_ = auVar79;
                      auVar80._20_4_ = fVar128 + fVar43;
                      auVar80._24_4_ = fVar129 + fVar44;
                      auVar80._28_4_ = auVar49._28_4_ + auVar59._28_4_ + fVar45;
                      auVar46 = vpminsd_avx(auVar12._16_16_,auVar74._16_16_);
                      auVar67 = vpminsd_avx(auVar58,auVar68);
                      auVar57 = vpminsd_avx(auVar13._16_16_,auVar78._16_16_);
                      auVar46 = vpmaxsd_avx(auVar46,auVar57);
                      auVar57 = vpminsd_avx(auVar47,auVar75);
                      auVar67 = vpmaxsd_avx(auVar67,auVar57);
                      auVar57 = vpminsd_avx(auVar32,auVar79);
                      auVar67 = vpmaxsd_avx(auVar67,auVar57);
                      auVar94 = ZEXT1664(auVar67);
                      auVar57 = vpminsd_avx(auVar14._16_16_,auVar80._16_16_);
                      auVar130 = ZEXT1664(auVar57);
                      auVar46 = vpmaxsd_avx(auVar46,auVar57);
                      auVar88._16_16_ = auVar46;
                      auVar88._0_16_ = auVar67;
                      auVar57 = vpmaxsd_avx(auVar12._16_16_,auVar74._16_16_);
                      auVar108 = vpmaxsd_avx(auVar58,auVar68);
                      auVar96 = vpmaxsd_avx(auVar13._16_16_,auVar78._16_16_);
                      auVar111 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                    CONCAT424(0x3f7ffffa,
                                                              CONCAT420(0x3f7ffffa,
                                                                        CONCAT416(0x3f7ffffa,
                                                                                  CONCAT412(
                                                  0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)
                                                  ))))));
                      auVar99 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar96 = vpminsd_avx(auVar57,auVar96);
                      auVar57 = vpmaxsd_avx(auVar47,auVar75);
                      auVar108 = vpminsd_avx(auVar108,auVar57);
                      auVar57 = vpmaxsd_avx(auVar32,auVar79);
                      auVar108 = vpminsd_avx(auVar108,auVar57);
                      auVar57 = vpmaxsd_avx(auVar14._16_16_,auVar80._16_16_);
                      auVar123 = ZEXT3264(local_5c20);
                      auVar119 = ZEXT3264(CONCAT428(0x3f800003,
                                                    CONCAT424(0x3f800003,
                                                              CONCAT420(0x3f800003,
                                                                        CONCAT416(0x3f800003,
                                                                                  CONCAT412(
                                                  0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)
                                                  ))))));
                      auVar57 = vpminsd_avx(auVar96,auVar57);
                      auVar33._0_4_ = auVar67._0_4_ * 0.99999964;
                      auVar33._4_4_ = auVar67._4_4_ * 0.99999964;
                      auVar33._8_4_ = auVar67._8_4_ * 0.99999964;
                      auVar33._12_4_ = auVar67._12_4_ * 0.99999964;
                      auVar34._16_4_ = auVar46._0_4_ * 0.99999964;
                      auVar34._0_16_ = auVar33;
                      auVar34._20_4_ = auVar46._4_4_ * 0.99999964;
                      auVar34._24_4_ = auVar46._8_4_ * 0.99999964;
                      auVar40._28_4_ = 0;
                      auVar40._0_28_ = auVar34;
                      auVar48._0_4_ = auVar108._0_4_ * 1.0000004;
                      auVar48._4_4_ = auVar108._4_4_ * 1.0000004;
                      auVar48._8_4_ = auVar108._8_4_ * 1.0000004;
                      auVar48._12_4_ = auVar108._12_4_ * 1.0000004;
                      auVar15._16_4_ = auVar57._0_4_ * 1.0000004;
                      auVar15._0_16_ = auVar48;
                      auVar15._20_4_ = auVar57._4_4_ * 1.0000004;
                      auVar15._24_4_ = auVar57._8_4_ * 1.0000004;
                      auVar15._28_4_ = auVar57._12_4_;
                      auVar46 = vpmaxsd_avx(auVar33,local_5a20._0_16_);
                      auVar67._12_4_ = 0;
                      auVar67._0_12_ = auVar34._16_12_;
                      auVar67 = vpmaxsd_avx(auVar67,local_5a20._16_16_);
                      auVar57 = vpminsd_avx(auVar48,local_5a00._0_16_);
                      auVar59._16_16_ = auVar67;
                      auVar59._0_16_ = auVar46;
                      auVar46 = vpminsd_avx(auVar15._16_16_,local_5a00._16_16_);
                      auVar51._16_16_ = auVar46;
                      auVar51._0_16_ = auVar57;
                      fStack_5c34 = fStack_5c38;
                      fStack_5c30 = fStack_5c38;
                      fStack_5c2c = fStack_5c38;
                      fStack_5c28 = fStack_5c38;
                      fStack_5c24 = fStack_5c38;
                    }
                    auVar89 = ZEXT3264(auVar88);
                    auVar81 = ZEXT3264(auVar80);
                    auVar59 = vcmpps_avx(auVar59,auVar51,2);
                    auVar46 = vpackssdw_avx(auVar59._0_16_,auVar59._16_16_);
                    auVar67 = vpmovzxwd_avx(auVar46);
                    auVar57 = vpslld_avx(auVar67,0x1f);
                    auVar62 = ZEXT1664(auVar57);
                    auVar67 = vpunpckhwd_avx(auVar46,auVar46);
                    auVar67 = vpslld_avx(auVar67,0x1f);
                    auVar73._16_16_ = auVar67;
                    auVar73._0_16_ = auVar57;
                    if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar73 >> 0x7f,0) != '\0') ||
                          (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB161(auVar67 >> 0x3f,0) != '\0') ||
                        (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar67[0xf] < '\0') {
                      auVar46 = vpunpckhwd_avx(auVar46,auVar46);
                      auVar46 = vpslld_avx(auVar46,0x1f);
                      auVar50._16_16_ = auVar46;
                      auVar50._0_16_ = auVar57;
                      auVar59 = vblendvps_avx(auVar99._0_32_,auVar40,auVar50);
                      if (uVar29 != 8) {
                        *puVar27 = uVar29;
                        puVar27 = puVar27 + 1;
                        *pauVar30 = auVar123._0_32_;
                        pauVar30 = pauVar30 + 1;
                      }
                      auVar123 = ZEXT3264(auVar59);
                      uVar29 = uVar4;
                    }
                  }
                  auVar59 = auVar123._0_32_;
                } while ((uVar4 != 8) && (bVar31 = uVar23 < 7, uVar23 = uVar23 + 1, bVar31));
                iVar25 = 0;
                if (uVar29 == 8) {
LAB_00491d30:
                  bVar31 = false;
                  iVar25 = 4;
                }
                else {
                  auVar72 = vcmpps_avx(local_5a00._0_32_,auVar59,6);
                  uVar28 = vmovmskps_avx(auVar72);
                  bVar31 = true;
                  if ((uint)POPCOUNT(uVar28) <= (uint)local_5c40) {
                    *puVar27 = uVar29;
                    puVar27 = puVar27 + 1;
                    *pauVar30 = auVar59;
                    pauVar30 = pauVar30 + 1;
                    goto LAB_00491d30;
                  }
                }
                root.ptr = uVar29;
              } while (bVar31);
            }
          }
        }
      } while (iVar25 != 3);
      auVar59 = vandps_avx(local_5be0,_local_5c60);
      auVar52._8_4_ = 0xff800000;
      auVar52._0_8_ = 0xff800000ff800000;
      auVar52._12_4_ = 0xff800000;
      auVar52._16_4_ = 0xff800000;
      auVar52._20_4_ = 0xff800000;
      auVar52._24_4_ = 0xff800000;
      auVar52._28_4_ = 0xff800000;
      auVar59 = vmaskmovps_avx(auVar59,auVar52);
      *(undefined1 (*) [32])(ray + 0x100) = auVar59;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }